

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspBerkmin::newConstraint
          (ClaspBerkmin *this,Solver *s,Literal *first,size_type size,ConstraintType t)

{
  Var v;
  uint in_ECX;
  Literal *in_RDX;
  Solver *in_RDI;
  int in_R8D;
  Literal *end_1;
  Literal *x_1;
  Literal *end;
  Literal *x;
  undefined8 in_stack_ffffffffffffff98;
  ClaspBerkmin *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  Order *in_stack_ffffffffffffffb8;
  Literal *pLVar1;
  undefined8 in_stack_ffffffffffffffc0;
  Literal *local_28;
  
  if (((in_R8D == 1) &&
      (hasActivities(in_stack_ffffffffffffffa0,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0)),
      (in_RDI->lower).field_0x6 == '\x01')) ||
     ((in_R8D == 0 && (((in_RDI->lower).field_0x4 & 1) != 0)))) {
    for (local_28 = in_RDX; local_28 != in_RDX + in_ECX; local_28 = local_28 + 1) {
      v = (Var)((ulong)&in_RDI->model >> 0x20);
      Literal::var(local_28);
      Solver::varInfo(in_RDI,v);
      VarInfo::nant((VarInfo *)0x23435b);
      Order::inc(in_stack_ffffffffffffffb8,
                 (Literal)(uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0));
    }
  }
  if ((in_R8D != 0) && (((in_RDI->lower).field_0x4 & 1) == 0)) {
    pLVar1 = in_RDX + in_ECX;
    for (; in_RDX != pLVar1; in_RDX = in_RDX + 1) {
      Order::incOcc((Order *)in_RDI,(Literal)in_RDX->rep_);
    }
  }
  return;
}

Assistant:

void ClaspBerkmin::newConstraint(const Solver& s, const Literal* first, LitVec::size_type size, ConstraintType t) {
	if (t == Constraint_t::Conflict) { hasActivities(true); }
	if ((t == Constraint_t::Conflict && order_.resScore == HeuParams::score_min)
	 || (t == Constraint_t::Static   && order_.huang)) {
		for (const Literal* x = first, *end = first+size; x != end; ++x) {
			order_.inc(*x, s.varInfo(x->var()).nant());
		}
	}
	if (t != Constraint_t::Static && !order_.huang) {
		for (const Literal* x = first, *end = first+size; x != end; ++x) { order_.incOcc(*x); }
	}
}